

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::push_back
          (vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_> *this,Image *value)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = this->nAlloc;
  sVar2 = this->nStored;
  if (sVar1 == sVar2) {
    sVar2 = 4;
    if (sVar1 != 0) {
      sVar2 = sVar1 * 2;
    }
    reserve(this,sVar2);
    sVar2 = this->nStored;
  }
  pbrt::Image::Image(this->ptr + sVar2,value);
  this->nStored = this->nStored + 1;
  return;
}

Assistant:

void push_back(T &&value) {
        if (nAlloc == nStored)
            reserve(nAlloc == 0 ? 4 : 2 * nAlloc);

        alloc.construct(ptr + nStored, std::move(value));
        ++nStored;
    }